

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
* __thiscall
BoardView::SearchPartsAndNets
          (pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
           *__return_storage_ptr__,BoardView *this,char *search,int limit)

{
  allocator<char> local_c9;
  vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> local_c8;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> local_a8;
  string local_88;
  SharedVector<Component> local_68;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> local_48;
  
  local_a8.
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->m_searchComponents == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,search,&local_c9);
    Searcher::parts(&local_68,&this->searcher,&local_88,limit);
    local_48.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_a8.
         super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_a8.
         super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_a8.
         super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_a8.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_a8.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_a8.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_68.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
              (&local_48);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
              (&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_searchNets == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,search,&local_c9);
    Searcher::nets((SharedVector<Net> *)&local_68,&this->searcher,&local_88,limit);
    local_48.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_c8.
                  super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_c8.
                  super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_c8.
                  super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_c8.super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_68.
                  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_c8.super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_68.
                  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_c8.super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_68.
                  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_68.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector
              ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)&local_48);
    std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector
              ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  ::
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_&,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_&,_true>
            (__return_storage_ptr__,&local_a8,&local_c8);
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector(&local_c8);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
            (&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::pair<SharedVector<Component>, SharedVector<Net>> BoardView::SearchPartsAndNets(const char *search, int limit) {
	SharedVector<Component> parts;
	SharedVector<Net> nets;
	if (m_searchComponents) parts = searcher.parts(search, limit);
	if (m_searchNets) nets = searcher.nets(search, limit);
	return {parts, nets};
}